

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_enc.c
# Opt level: O0

int VP8GetCostLuma16(VP8EncIterator *it,VP8ModeScore *rd)

{
  int iVar1;
  VP8Encoder *enc_00;
  int iVar2;
  long in_RSI;
  VP8EncIterator *in_RDI;
  int ctx;
  int R;
  int y;
  int x;
  VP8Encoder *enc;
  VP8Residual res;
  int local_54;
  int local_50;
  int local_4c;
  VP8Residual local_40;
  long local_10;
  VP8EncIterator *local_8;
  
  enc_00 = in_RDI->enc_;
  local_10 = in_RSI;
  local_8 = in_RDI;
  VP8IteratorNzToBytes(in_RDI);
  VP8InitResidual(0,1,enc_00,&local_40);
  (*VP8SetResidualCoeffs)((int16_t *)(local_10 + 0x28),&local_40);
  local_54 = (*VP8GetResidualCost)(local_8->top_nz_[8] + local_8->left_nz_[8],&local_40);
  VP8InitResidual(1,0,enc_00,&local_40);
  for (local_50 = 0; local_50 < 4; local_50 = local_50 + 1) {
    for (local_4c = 0; local_4c < 4; local_4c = local_4c + 1) {
      iVar2 = local_8->top_nz_[local_4c];
      iVar1 = local_8->left_nz_[local_50];
      (*VP8SetResidualCoeffs)
                ((int16_t *)(local_10 + 0x48 + (long)(local_4c + local_50 * 4) * 0x20),&local_40);
      iVar2 = (*VP8GetResidualCost)(iVar2 + iVar1,&local_40);
      local_54 = iVar2 + local_54;
      local_8->left_nz_[local_50] = (uint)(-1 < local_40.last);
      local_8->top_nz_[local_4c] = (uint)(-1 < local_40.last);
    }
  }
  return local_54;
}

Assistant:

int VP8GetCostLuma16(VP8EncIterator* const it, const VP8ModeScore* const rd) {
  VP8Residual res;
  VP8Encoder* const enc = it->enc_;
  int x, y;
  int R = 0;

  VP8IteratorNzToBytes(it);   // re-import the non-zero context

  // DC
  VP8InitResidual(0, 1, enc, &res);
  VP8SetResidualCoeffs(rd->y_dc_levels, &res);
  R += VP8GetResidualCost(it->top_nz_[8] + it->left_nz_[8], &res);

  // AC
  VP8InitResidual(1, 0, enc, &res);
  for (y = 0; y < 4; ++y) {
    for (x = 0; x < 4; ++x) {
      const int ctx = it->top_nz_[x] + it->left_nz_[y];
      VP8SetResidualCoeffs(rd->y_ac_levels[x + y * 4], &res);
      R += VP8GetResidualCost(ctx, &res);
      it->top_nz_[x] = it->left_nz_[y] = (res.last >= 0);
    }
  }
  return R;
}